

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

char * lyd_path(lyd_node *node)

{
  char *pcVar1;
  
  pcVar1 = _lyd_path(node,0);
  return pcVar1;
}

Assistant:

static char *
_lyd_path(const struct lyd_node *node, int prefix_all)
{
    char *buf_backup = NULL, *buf = ly_buf(), *result = NULL;
    uint16_t index = LY_BUF_SIZE - 1;

    if (!node) {
        LOGERR(LY_EINVAL, "%s: NULL node parameter", __func__);
        return NULL;
    }

    /* backup the shared internal buffer */
    if (ly_buf_used && buf[0]) {
        buf_backup = strndup(buf, LY_BUF_SIZE - 1);
    }
    ly_buf_used++;

    /* build the path */
    buf[index] = '\0';
    ly_vlog_build_path_reverse(LY_VLOG_LYD, node, buf, &index, prefix_all);
    result = strdup(&buf[index]);

    /* restore the shared internal buffer */
    if (buf_backup) {
        strncpy(buf, buf_backup, LY_BUF_SIZE - 1);
        free(buf_backup);
    }
    ly_buf_used--;

    return result;
}